

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::printHeaderString(ConsoleReporter *this,string *_string,size_t indent)

{
  TextAttributes *this_00;
  ostream *poVar1;
  size_t in_RDX;
  Text *in_RSI;
  ostream *in_RDI;
  size_t i;
  string *in_stack_000000d8;
  Text *in_stack_000000e0;
  Text *in_stack_ffffffffffffff48;
  TextAttributes local_98 [3];
  long local_20;
  size_t local_18;
  Text *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = std::__cxx11::string::find((char *)in_RSI,0x1ce422);
  if (local_20 == -1) {
    local_20 = 0;
  }
  else {
    local_20 = local_20 + 2;
  }
  Tbc::TextAttributes::TextAttributes(local_98);
  this_00 = Tbc::TextAttributes::setIndent(local_98,local_18 + local_20);
  Tbc::TextAttributes::setInitialIndent(this_00,local_18);
  Tbc::Text::Text(in_stack_000000e0,in_stack_000000d8,(TextAttributes *)this);
  poVar1 = Tbc::operator<<(in_RDI,in_stack_ffffffffffffff48);
  std::operator<<(poVar1,"\n");
  Tbc::Text::~Text(local_10);
  return;
}

Assistant:

void printHeaderString( std::string const& _string, std::size_t indent = 0 ) {
            std::size_t i = _string.find( ": " );
            if( i != std::string::npos )
                i+=2;
            else
                i = 0;
            stream << Text( _string, TextAttributes()
                                        .setIndent( indent+i)
                                        .setInitialIndent( indent ) ) << "\n";
        }